

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  int iVar1;
  Layer *pLVar2;
  reference pvVar3;
  reference pvVar4;
  reference ppLVar5;
  long *in_RSI;
  long in_RDI;
  int lr;
  int pdlr;
  Blob *blob_1;
  int top_blob_index;
  int j_1;
  Blob *blob;
  int bottom_blob_index;
  int j;
  int custom_index;
  Layer *layer;
  int top_count;
  int bottom_count;
  int typeindex;
  int i;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  int in_stack_fffffffffffff644;
  int in_stack_fffffffffffff648;
  int in_stack_fffffffffffff64c;
  int in_stack_fffffffffffff650;
  int in_stack_fffffffffffff654;
  Layer *in_stack_fffffffffffff658;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff684;
  int local_970;
  int local_96c;
  reference local_968;
  int local_95c;
  int local_958;
  uint local_954;
  Layer *local_950;
  undefined4 local_948;
  int local_938;
  int local_934;
  uint local_930;
  int local_92c;
  undefined1 local_928 [2308];
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  int local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  iVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,&local_1c,4);
  if (iVar1 == 4) {
    if (local_1c == 0x7685dd) {
      local_20 = 0;
      local_24 = 0;
      iVar1 = (**(code **)(*local_18 + 0x18))(local_18,&local_20,4);
      if (iVar1 == 4) {
        iVar1 = (**(code **)(*local_18 + 0x18))(local_18,&local_24,4);
        if (iVar1 == 4) {
          if ((local_20 < 1) || (local_24 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count\n");
            local_4 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       in_stack_fffffffffffff660,(size_type)in_stack_fffffffffffff658);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (in_stack_fffffffffffff660,(size_type)in_stack_fffffffffffff658);
            ParamDict::ParamDict
                      ((ParamDict *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
            for (local_92c = 0; local_92c < local_20; local_92c = local_92c + 1) {
              iVar1 = (**(code **)(*local_18 + 0x18))(local_18,&local_930,4);
              if (iVar1 != 4) {
                fprintf(_stderr,"read typeindex failed\n");
                local_4 = -1;
                goto LAB_001301e6;
              }
              iVar1 = (**(code **)(*local_18 + 0x18))(local_18,&local_934,4);
              if (iVar1 != 4) {
                fprintf(_stderr,"read bottom_count failed\n");
                local_4 = -1;
                goto LAB_001301e6;
              }
              iVar1 = (**(code **)(*local_18 + 0x18))(local_18,&local_938,4);
              if (iVar1 != 4) {
                fprintf(_stderr,"read top_count failed\n");
                local_4 = -1;
                goto LAB_001301e6;
              }
              pLVar2 = create_layer(in_stack_fffffffffffff64c);
              local_950 = pLVar2;
              if (pLVar2 == (Layer *)0x0) {
                local_954 = local_930 & 0xfffffeff;
                in_stack_fffffffffffff658 =
                     create_custom_layer((Net *)CONCAT44(in_stack_fffffffffffff64c,
                                                         in_stack_fffffffffffff648),
                                         in_stack_fffffffffffff644);
                local_950 = in_stack_fffffffffffff658;
              }
              if (local_950 == (Layer *)0x0) {
                fprintf(_stderr,"layer %d not exists or registered\n",(ulong)local_930);
                clear((Net *)pLVar2);
                local_4 = -1;
                goto LAB_001301e6;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)pLVar2,
                         (size_type)in_stack_fffffffffffff658);
              for (local_958 = 0; local_958 < local_934; local_958 = local_958 + 1) {
                in_stack_fffffffffffff654 = (**(code **)(*local_18 + 0x18))(local_18,&local_95c,4);
                if (in_stack_fffffffffffff654 != 4) {
                  fprintf(_stderr,"read bottom_blob_index failed\n");
                  local_4 = -1;
                  goto LAB_001301e6;
                }
                local_968 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI + 0x28),(long)local_95c);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                           (value_type_conflict2 *)
                           CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
                in_stack_fffffffffffff650 = local_95c;
                pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_950->bottoms,(long)local_958);
                *pvVar3 = in_stack_fffffffffffff650;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)pLVar2,
                         (size_type)in_stack_fffffffffffff658);
              for (local_96c = 0; local_96c < local_938; local_96c = local_96c + 1) {
                in_stack_fffffffffffff64c = (**(code **)(*local_18 + 0x18))(local_18,&local_970,4);
                if (in_stack_fffffffffffff64c != 4) {
                  fprintf(_stderr,"read top_blob_index failed\n");
                  local_4 = -1;
                  goto LAB_001301e6;
                }
                pvVar4 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                   ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                    (in_RDI + 0x28),(long)local_970);
                pvVar4->producer = local_92c;
                in_stack_fffffffffffff648 = local_970;
                pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_950->tops,(long)local_96c);
                *pvVar3 = in_stack_fffffffffffff648;
              }
              in_stack_fffffffffffff644 =
                   ParamDict::load_param_bin
                             ((ParamDict *)in_stack_fffffffffffff658,
                              (DataReader *)
                              CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
              if (in_stack_fffffffffffff644 == 0) {
                iVar1 = (*local_950->_vptr_Layer[2])(local_950,local_928);
                pLVar2 = local_950;
                if (iVar1 == 0) {
                  ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                       (in_RDI + 0x40),(long)local_92c);
                  *ppLVar5 = pLVar2;
                }
                else {
                  fprintf(_stderr,"layer load_param failed\n");
                }
              }
              else {
                fprintf(_stderr,"ParamDict load_param failed\n");
              }
            }
            local_4 = 0;
LAB_001301e6:
            local_948 = 1;
            ParamDict::~ParamDict
                      ((ParamDict *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
          }
        }
        else {
          fprintf(_stderr,"read blob_count failed\n");
          local_4 = -1;
        }
      }
      else {
        fprintf(_stderr,"read layer_count failed\n");
        local_4 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate\n");
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"read magic failed\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        fprintf(stderr, "read " #buf " failed\n"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}